

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

bool __thiscall CDirectiveSkip::Validate(CDirectiveSkip *this,ValidateState *state)

{
  bool bVar1;
  int64_t iVar2;
  Architecture *pAVar3;
  ValidateState *state_local;
  CDirectiveSkip *this_local;
  
  iVar2 = FileManager::getVirtualAddress(g_fileManager);
  this->virtualAddress = iVar2;
  bVar1 = Expression::isLoaded(&this->expression);
  if ((!bVar1) || (bVar1 = Expression::evaluateInteger<long>(&this->expression,&this->value), bVar1)
     ) {
    pAVar3 = Architecture::current();
    (*pAVar3->_vptr_Architecture[3])();
    FileManager::advanceMemory(g_fileManager,this->value);
  }
  else {
    Logger::queueError<>(FatalError,"Invalid skip length");
  }
  return false;
}

Assistant:

bool CDirectiveSkip::Validate(const ValidateState &state)
{
	virtualAddress = g_fileManager->getVirtualAddress();

	if (expression.isLoaded())
	{
		if (!expression.evaluateInteger(value))
		{
			Logger::queueError(Logger::FatalError, "Invalid skip length");
			return false;
		}
	}

	Architecture::current().NextSection();
	g_fileManager->advanceMemory(value);

	return false;
}